

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int get_test_arg(int argc,char **argv,TEST_ARGS *args)

{
  int64_t *piVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int64_t *piVar6;
  
  piVar1 = &args->num_threads;
  lVar5 = 1;
  do {
    if (argc <= lVar5) {
      args->ok = 0;
      lVar5 = 4;
      if (0 < args->num_threads) {
        lVar5 = args->num_threads;
      }
      args->num_threads = lVar5;
      lVar5 = 0x3039;
      if (0 < args->N) {
        lVar5 = args->N;
      }
      args->N = lVar5;
      return 0;
    }
    plVar2 = (long *)argv[lVar5];
    lVar4 = 8;
    piVar6 = piVar1;
    if ((*plVar2 == 0x3d53444145524854) || (*plVar2 == 0x3d73646165726874)) {
LAB_00101583:
      iVar3 = atoi((char *)((long)plVar2 + lVar4));
      *piVar6 = (long)iVar3;
    }
    else {
      lVar4 = 2;
      if (((short)*plVar2 == 0x3d74) ||
         ((((short)*plVar2 == 0x3d54 || (piVar6 = &args->N, (short)*plVar2 == 0x3d6e)) ||
          ((short)*plVar2 == 0x3d4e)))) goto LAB_00101583;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int get_test_arg(int argc, char **argv, TEST_ARGS *args)
{
    int ret = GML_ERROR;

    for (int i = 1; i < argc; i++) {
        if (memcmp(argv[i], "THREADS=", 8) == 0 || memcmp(argv[i], "threads=", 8) == 0) {
            args->num_threads = atoi(argv[i] + 8);
            continue;
        }

        if (memcmp(argv[i], "t=", 2) == 0 || memcmp(argv[i], "T=", 2) == 0) {
            args->num_threads = atoi(argv[i] + 2);
            continue;
        }

        if (memcmp(argv[i], "n=", 2) == 0 || memcmp(argv[i], "N=", 2) == 0) {
            args->N = atoi(argv[i] + 2);
            continue;
        }
    }

    args->ok = 0;
    args->num_threads = args->num_threads > 0 ? args->num_threads : 4;
    args->N = args->N > 0 ? args->N : 12345; 

    return ret;
}